

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::RenameColumnInfo,duckdb::AlterEntryData,std::__cxx11::string_const&,std::__cxx11::string_const&>
          (duckdb *this,AlterEntryData *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  RenameColumnInfo *this_00;
  string local_d0;
  string local_b0;
  AlterEntryData local_90;
  
  this_00 = (RenameColumnInfo *)operator_new(0xb8);
  AlterEntryData::AlterEntryData(&local_90,args);
  ::std::__cxx11::string::string((string *)&local_b0,(string *)args_1);
  ::std::__cxx11::string::string((string *)&local_d0,(string *)args_2);
  RenameColumnInfo::RenameColumnInfo(this_00,&local_90,&local_b0,&local_d0);
  *(RenameColumnInfo **)this = this_00;
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  AlterEntryData::~AlterEntryData(&local_90);
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}